

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

void __thiscall
mxx::future<std::vector<int,_std::allocator<int>_>_>::future
          (future<std::vector<int,_std::allocator<int>_>_> *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  future<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  impl::future_base<std::vector<int,_std::allocator<int>_>_>::future_base
            (&this->super_future_base<std::vector<int,_std::allocator<int>_>_>);
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>)._vptr_future_base =
       (_func_int **)&PTR__future_002039b8;
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  std::
  unique_ptr<std::vector<int,std::allocator<int>>,std::default_delete<std::vector<int,std::allocator<int>>>>
  ::unique_ptr<std::default_delete<std::vector<int,std::allocator<int>>>,void>
            ((unique_ptr<std::vector<int,std::allocator<int>>,std::default_delete<std::vector<int,std::allocator<int>>>>
              *)&this->m_data,this_00);
  return;
}

Assistant:

future() : impl::future_base<T>(), m_data(new T()) {}